

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_dictionary.hpp
# Opt level: O2

bool pd::prepareData(string *dir_name,string *data_filename,string *dict_filename,
                    uint32_t num_dimensions)

{
  string *__return_storage_ptr__;
  uint uVar1;
  bool bVar2;
  auto_any<boost::filesystem::directory_iterator> aVar3;
  ostream *poVar4;
  istream *piVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  iterator iVar8;
  basic_ostream<char,_std::char_traits<char>_> *pbVar9;
  _Base_ptr p_Var10;
  ostream local_548 [8];
  ofstream of;
  undefined1 local_348 [8];
  ifstream fi;
  uint auStack_328 [122];
  undefined1 local_140 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  dict;
  path targetDir;
  uint32_t key;
  undefined1 local_c8 [8];
  string line;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  result;
  directory_iterator local_68;
  directory_iterator it;
  directory_iterator eod;
  uint local_4c;
  directory_iterator local_48;
  reference local_40;
  uint local_34;
  
  local_140 = (undefined1  [8])&dict._M_h._M_rehash_policy._M_next_resize;
  dict._M_h._M_buckets = (__buckets_ptr)0x1;
  dict._M_h._M_bucket_count = 0;
  dict._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  dict._M_h._M_element_count._0_4_ = 0x3f800000;
  dict._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  dict._M_h._M_rehash_policy._4_4_ = 0;
  dict._M_h._M_rehash_policy._M_next_resize = 0;
  bVar2 = readDictionary(dict_filename,
                         (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          *)local_140);
  if (bVar2) {
    std::__cxx11::string::string((string *)&dict._M_h._M_single_bucket,(string *)dir_name);
    boost::filesystem::directory_iterator::directory_iterator
              (&local_68,(path *)&dict._M_h._M_single_bucket,none);
    it.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
    std::ofstream::ofstream(local_548,(string *)data_filename,_S_out);
    local_348 = (undefined1  [8])local_68.m_imp.px;
    if (local_68.m_imp.px != (dir_itr_imp *)0x0) {
      LOCK();
      *(int *)local_68.m_imp.px = *(int *)local_68.m_imp.px + 1;
      UNLOCK();
    }
    _fi = (directory_iterator)(directory_iterator)it.m_imp.px;
    if (it.m_imp.px != (dir_itr_imp *)0x0) {
      LOCK();
      *(int *)it.m_imp.px = *(int *)it.m_imp.px + 1;
      UNLOCK();
    }
    result._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_68.m_imp.px;
    if (local_68.m_imp.px != (dir_itr_imp *)0x0) {
      LOCK();
      *(int *)local_68.m_imp.px = *(int *)local_68.m_imp.px + 1;
      UNLOCK();
    }
    if (it.m_imp.px != (dir_itr_imp *)0x0) {
      LOCK();
      *(int *)it.m_imp.px = *(int *)it.m_imp.px + 1;
      UNLOCK();
    }
    std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>::~pair
              ((pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator> *
               )local_348);
    boost::foreach_detail_::
    begin<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
              ((auto_any_t)&local_48,
               (type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
                *)&result._M_t._M_impl.super__Rb_tree_header._M_node_count,(true_ *)0x0);
    p_Var10 = (_Base_ptr)0x0;
    aVar3 = boost::foreach_detail_::
            end<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
                      ((auto_any_t)&eod,
                       (type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
                        *)&result._M_t._M_impl.super__Rb_tree_header._M_node_count,(true_ *)0x0);
    local_34 = (uint)CONCAT71(aVar3.item.m_imp.px._1_7_,1);
    __return_storage_ptr__ = (string *)(targetDir.m_pathname.field_2._M_local_buf + 8);
    while ((local_34 & 1) != 0) {
      bVar2 = boost::filesystem::directory_iterator::equal(&local_48,&eod);
      if (bVar2) break;
      local_40 = boost::filesystem::directory_iterator::dereference(&local_48);
      local_34 = 0;
      while ((local_34 & 1) == 0) {
        bVar2 = boost::filesystem::is_regular_file((path *)local_40);
        p_Var10 = (_Base_ptr)CONCAT71((int7)((ulong)p_Var10 >> 8),1);
        local_34 = (uint)p_Var10;
        if (bVar2) {
          boost::filesystem::path::extension();
          bVar2 = boost::filesystem::operator==((path *)local_348,"swp");
          std::__cxx11::string::~string((string *)local_348);
          if (!bVar2) {
            std::ifstream::ifstream((string *)local_348,(string *)local_40,_S_in);
            uVar1 = *(uint *)((long)auStack_328 + *(long *)((long)local_348 + -0x18));
            if ((uVar1 & 5) == 0) {
              local_c8 = (undefined1  [8])&line._M_string_length;
              line._M_dataplus._M_p = (pointer)0x0;
              line._M_string_length._0_1_ = 0;
              result._M_t._M_impl._0_4_ = 0;
              result._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              result._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
              result._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&result;
              result._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
              result._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   result._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              while( true ) {
                piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                   ((istream *)local_348,(string *)local_c8);
                p_Var10 = *(_Base_ptr *)(*(long *)piVar5 + -0x18);
                if ((((byte)(piVar5 + 0x20)[(long)p_Var10] & 5) != 0) ||
                   (line._M_dataplus._M_p == (pointer)0x0)) break;
                iVar6 = std::
                        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                *)local_140,(key_type *)local_c8);
                if (iVar6.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                    ._M_cur != (__node_type *)0x0) {
                  targetDir.m_pathname.field_2._8_4_ =
                       *(uint *)((long)iVar6.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                                       ._M_cur + 0x28) % num_dimensions;
                  pmVar7 = std::
                           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                           ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                         *)((long)&line.field_2 + 8),
                                        (key_type *)__return_storage_ptr__);
                  *pmVar7 = *pmVar7 + 1;
                }
              }
              for (local_4c = 0; local_4c < num_dimensions; local_4c = local_4c + 1) {
                iVar8 = std::
                        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                        ::find((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                *)((long)&line.field_2 + 8),&local_4c);
                p_Var10 = (_Base_ptr)&result;
                if (iVar8._M_node == p_Var10) {
                  std::operator<<(local_548,"0,");
                }
                else {
                  std::__cxx11::to_string
                            (__return_storage_ptr__,*(uint *)&iVar8._M_node[1].field_0x4);
                  poVar4 = std::operator<<(local_548,(string *)__return_storage_ptr__);
                  std::operator<<(poVar4,",");
                  std::__cxx11::string::~string((string *)__return_storage_ptr__);
                }
              }
              boost::filesystem::path::filename();
              pbVar9 = boost::filesystem::operator<<
                                 ((basic_ostream<char,_std::char_traits<char>_> *)local_548,
                                  (path *)__return_storage_ptr__);
              std::endl<char,std::char_traits<char>>((ostream *)pbVar9);
              std::__cxx11::string::~string((string *)__return_storage_ptr__);
              std::
              _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
              ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                           *)((long)&line.field_2 + 8));
              std::__cxx11::string::~string((string *)local_c8);
            }
            else {
              poVar4 = std::operator<<((ostream *)&std::cerr,"File ");
              poVar4 = std::operator<<(poVar4,(string *)local_40);
              poVar4 = std::operator<<(poVar4,"doesn\'t exist");
              std::endl<char,std::char_traits<char>>(poVar4);
            }
            std::ifstream::~ifstream((string *)local_348);
            if ((uVar1 & 5) != 0) {
              boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
                        (&eod.m_imp);
              boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
                        (&local_48.m_imp);
              bVar2 = false;
              goto LAB_00112012;
            }
          }
        }
      }
      boost::filesystem::directory_iterator::increment(&local_48);
    }
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&eod.m_imp);
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_48.m_imp);
    bVar2 = true;
LAB_00112012:
    std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>::~pair
              ((pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator> *
               )&result._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::ofstream::~ofstream(local_548);
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&it.m_imp);
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_68.m_imp);
    std::__cxx11::string::~string((string *)&dict._M_h._M_single_bucket);
  }
  else {
    bVar2 = false;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_140);
  return bVar2;
}

Assistant:

bool prepareData(const std::string& dir_name, const std::string& data_filename, const std::string& dict_filename, const uint32_t num_dimensions)
    {
        std::unordered_map<std::string, uint32_t> dict;
        if (!readDictionary(dict_filename, dict))
            return false;
        
        fs::path targetDir(dir_name); 
        fs::directory_iterator it(targetDir), eod;

        std::ofstream of(data_filename);
        BOOST_FOREACH(const fs::path &p, std::make_pair(it, eod))   
        { 
            if(is_regular_file(p))
            {
                if (p.extension() == "swp")
                    continue;
                std::ifstream fi(p.string());
                if (not fi)
                {
                    std::cerr << "File " << p.string() << "doesn't exist" << std::endl;
                    return false;
                }

                std::string line;
                std::map<uint32_t, uint32_t> result;
                std::hash<uint32_t> uint32_hash;
                while (std::getline(fi, line) and !line.empty())
                {
                    const std::unordered_map<std::string, uint32_t>::const_iterator it = dict.find(line);
                    if (it == dict.end())
                        continue;
                    
                    uint32_t key = uint32_hash(it->second) % num_dimensions;
                    result[key]++;
                }
                
                for (uint32_t i = 0; i < num_dimensions; i++)
                {
                    const std::map<uint32_t, uint32_t>::const_iterator it = result.find(i);
                    if (it == result.end())
                        of << "0,";
                    else
                        of << std::to_string(it->second) << ",";    
                }
                of << p.filename() << std::endl;
            } 
        }
        return true;
    }